

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

PHYSFS_EnumerateCallbackResult setSaneCfgEnumCallback(void *_data,char *dir,char *f)

{
  undefined1 *ptr;
  size_t sVar1;
  setSaneCfgEnumData *psVar2;
  int iVar3;
  PHYSFS_ErrorCode PVar4;
  size_t sVar5;
  char *pcVar6;
  char *__s;
  undefined1 **ppuVar7;
  undefined1 *local_68;
  char *local_60;
  char *str;
  size_t allocsize;
  char *d;
  char *pcStack_40;
  char dirsep;
  char *ext;
  size_t l;
  size_t extlen;
  setSaneCfgEnumData *data;
  char *f_local;
  char *dir_local;
  void *_data_local;
  
  ppuVar7 = &local_68;
  l = *(size_t *)((long)_data + 8);
  extlen = (size_t)_data;
  data = (setSaneCfgEnumData *)f;
  f_local = dir;
  dir_local = (char *)_data;
  ext = (char *)strlen(f);
  if ((l < ext) && ((ext + (-1 - l))[(long)&data->archiveExt] == '.')) {
    pcStack_40 = (char *)((long)data + ((long)ext - l));
    iVar3 = PHYSFS_utf8stricmp(pcStack_40,*(char **)extlen);
    if (iVar3 == 0) {
      d._7_1_ = 0x2f;
      allocsize = (size_t)PHYSFS_getRealDir((char *)data);
      sVar5 = strlen((char *)allocsize);
      pcVar6 = ext + sVar5 + 2;
      if (pcVar6 < (char *)0x100) {
        ppuVar7 = (undefined1 **)
                  ((long)&local_68 - ((ulong)(ext + sVar5 + 0x19) & 0xfffffffffffffff0));
        local_68 = (undefined1 *)ppuVar7;
      }
      else {
        local_68 = (undefined1 *)0x0;
      }
      ptr = local_68;
      str = pcVar6;
      *(undefined8 *)((long)ppuVar7 + -8) = 0x10995c;
      __s = (char *)__PHYSFS_initSmallAlloc(ptr,(size_t)pcVar6);
      psVar2 = data;
      sVar1 = allocsize;
      pcVar6 = str;
      if (__s == (char *)0x0) {
        *(undefined4 *)(extlen + 0x14) = 2;
      }
      else {
        local_60 = __s;
        *(undefined8 *)((long)ppuVar7 + -8) = 0x109998;
        snprintf(__s,(size_t)pcVar6,"%s%c%s",sVar1,0x2f,psVar2);
        pcVar6 = local_60;
        iVar3 = *(int *)(extlen + 0x10);
        *(undefined8 *)((long)ppuVar7 + -8) = 0x1099b5;
        iVar3 = PHYSFS_mount(pcVar6,(char *)0x0,(uint)(iVar3 == 0));
        if (iVar3 == 0) {
          *(undefined8 *)((long)ppuVar7 + -8) = 0x1099bf;
          PVar4 = currentErrorCode();
          *(PHYSFS_ErrorCode *)(extlen + 0x14) = PVar4;
        }
        pcVar6 = local_60;
        *(undefined8 *)((long)ppuVar7 + -8) = 0x1099d1;
        __PHYSFS_smallFree(pcVar6);
      }
    }
  }
  return PHYSFS_ENUM_OK;
}

Assistant:

static PHYSFS_EnumerateCallbackResult setSaneCfgEnumCallback(void *_data,
                                                const char *dir, const char *f)
{
    setSaneCfgEnumData *data = (setSaneCfgEnumData *) _data;
    const size_t extlen = data->archiveExtLen;
    const size_t l = strlen(f);
    const char *ext;

    if ((l > extlen) && (f[l - extlen - 1] == '.'))
    {
        ext = f + (l - extlen);
        if (PHYSFS_utf8stricmp(ext, data->archiveExt) == 0)
        {
            const char dirsep = __PHYSFS_platformDirSeparator;
            const char *d = PHYSFS_getRealDir(f);
            const size_t allocsize = strlen(d) + l + 2;
            char *str = (char *) __PHYSFS_smallAlloc(allocsize);
            if (str == NULL)
                data->errcode = PHYSFS_ERR_OUT_OF_MEMORY;
            else
            {
                snprintf(str, allocsize, "%s%c%s", d, dirsep, f);
                if (!PHYSFS_mount(str, NULL, data->archivesFirst == 0))
                    data->errcode = currentErrorCode();
                __PHYSFS_smallFree(str);
            } /* else */
        } /* if */
    } /* if */

    /* !!! FIXME: if we want to abort on errors... */
    /*return (data->errcode != PHYSFS_ERR_OK) ? PHYSFS_ENUM_ERROR : PHYSFS_ENUM_OK;*/

    return PHYSFS_ENUM_OK;  /* keep going */
}